

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O3

bool __thiscall
MeCab::FeatureIndex::buildUnigramFeature(FeatureIndex *this,LearnerPath *path,char *ufeature)

{
  StringBuffer *this_00;
  char cVar1;
  byte bVar2;
  pointer piVar3;
  mecab_learner_node_t *pmVar4;
  iterator iVar5;
  _func_int ***ppp_Var6;
  _func_int ***ppp_Var7;
  byte bVar8;
  size_t sVar9;
  FeatureIndex *pFVar10;
  ostream *poVar11;
  int *piVar12;
  ulong uVar13;
  FeatureIndex *pFVar14;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *__buf_00;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *extraout_RDX_09;
  FeatureIndex *pFVar15;
  FeatureIndex *pFVar16;
  FeatureIndex *this_01;
  char **ppcVar17;
  char *pcVar18;
  pointer ppcVar20;
  char *p;
  int id;
  char *local_78;
  int local_6c;
  FeatureIndex *local_68;
  char **local_60;
  FeatureIndex *local_58;
  FeatureIndex *local_50;
  LearnerPath *local_48;
  FeatureIndex *local_40;
  char *local_38;
  char *pcVar19;
  
  local_48 = path;
  local_38 = ufeature;
  local_50 = (FeatureIndex *)operator_new__(0x800);
  local_60 = (char **)operator_new__(0x200);
  pFVar14 = local_50;
  piVar3 = (this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar3) {
    (this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  local_68 = this;
  strncpy((char *)local_50,local_38,0x800);
  this_01 = pFVar14;
  sVar9 = strlen((char *)pFVar14);
  if ((long)sVar9 < 1) {
    local_58 = (FeatureIndex *)0x0;
    __buf = extraout_RDX;
    pFVar16 = local_58;
  }
  else {
    pFVar15 = (FeatureIndex *)((long)&pFVar14->_vptr_FeatureIndex + sVar9);
    local_58 = (FeatureIndex *)0x0;
    ppcVar17 = local_60;
    uVar13 = 0x40;
    do {
      for (; (cVar1 = *(char *)&pFVar14->_vptr_FeatureIndex, cVar1 == '\t' || (cVar1 == ' '));
          pFVar14 = (FeatureIndex *)((long)&pFVar14->_vptr_FeatureIndex + 1)) {
      }
      if (cVar1 == '\"') {
        pFVar14 = (FeatureIndex *)((long)&pFVar14->_vptr_FeatureIndex + 1);
        pFVar16 = pFVar14;
        for (pFVar10 = pFVar14;
            (this_01 = pFVar10, pFVar10 < pFVar15 &&
            ((ppp_Var6 = &pFVar10->_vptr_FeatureIndex, *(char *)ppp_Var6 != '\"' ||
             (this_01 = (FeatureIndex *)((long)&pFVar10->_vptr_FeatureIndex + 1),
             ppp_Var7 = &pFVar10->_vptr_FeatureIndex, pFVar10 = this_01,
             *(char *)((long)ppp_Var7 + 1) == '\"'))));
            pFVar10 = (FeatureIndex *)((long)&pFVar10->_vptr_FeatureIndex + 1)) {
          *(char *)&pFVar16->_vptr_FeatureIndex = *(char *)ppp_Var6;
          pFVar16 = (FeatureIndex *)((long)&pFVar16->_vptr_FeatureIndex + 1);
        }
        local_78 = (char *)CONCAT71(local_78._1_7_,0x2c);
        pFVar10 = (FeatureIndex *)
                  std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            (this_01,pFVar15,&stack0xffffffffffffff88);
        __buf = extraout_RDX_00;
      }
      else {
        local_78 = (char *)CONCAT71(local_78._1_7_,0x2c);
        this_01 = pFVar14;
        pFVar10 = (FeatureIndex *)
                  std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            (pFVar14,pFVar15,&stack0xffffffffffffff88);
        __buf = extraout_RDX_01;
        pFVar16 = pFVar10;
      }
      if (uVar13 < 2) {
        *ppcVar17 = (char *)pFVar14;
        pFVar16 = (FeatureIndex *)((long)&local_58->_vptr_FeatureIndex + 1);
        if (uVar13 - 1 == 0) break;
      }
      else {
        *(char *)&pFVar16->_vptr_FeatureIndex = '\0';
        *ppcVar17 = (char *)pFVar14;
      }
      local_58 = (FeatureIndex *)((long)&local_58->_vptr_FeatureIndex + 1);
      ppcVar17 = ppcVar17 + 1;
      pFVar14 = (FeatureIndex *)((long)&pFVar10->_vptr_FeatureIndex + 1);
      pFVar16 = local_58;
      uVar13 = uVar13 - 1;
    } while (pFVar14 < pFVar15);
  }
  local_58 = pFVar16;
  pFVar14 = (FeatureIndex *)&local_68->feature_;
  ppcVar20 = (local_68->unigram_templs_).
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_40 = pFVar14;
  if (ppcVar20 ==
      (local_68->unigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
LAB_00166f37:
    pFVar14 = local_68;
    local_78 = (char *)CONCAT44(local_78._4_4_,0xffffffff);
    iVar5._M_current =
         (local_68->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (local_68->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)local_40,iVar5,(int *)&stack0xffffffffffffff88
                );
      piVar12 = (pFVar14->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    else {
      *iVar5._M_current = -1;
      piVar12 = iVar5._M_current + 1;
      (local_68->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar12;
    }
    piVar12 = ChunkFreeList<int>::alloc
                        (&pFVar14->feature_freelist_,
                         (long)piVar12 -
                         (long)(pFVar14->feature_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2);
    local_48->rnode->fvector = piVar12;
    piVar3 = (pFVar14->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar9 = (long)(pFVar14->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar3;
    if (sVar9 != 0) {
      memmove(piVar12,piVar3,sVar9);
      piVar3 = (pFVar14->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pFVar14->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar3) {
        (pFVar14->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar3;
      }
    }
    operator_delete__(local_60);
    operator_delete__(local_50);
    return true;
  }
  this_00 = &local_68->os_;
LAB_00166cb3:
  pcVar18 = *ppcVar20;
  (local_68->os_).size_ = 0;
  do {
    cVar1 = *pcVar18;
    if (cVar1 == '%') {
      pcVar19 = pcVar18 + 1;
      bVar2 = pcVar18[1];
      local_78 = pcVar19;
      if (bVar2 < 0x75) {
        if (bVar2 == 0x46) {
          pFVar14 = local_58;
          pcVar18 = getIndex(this_01,&stack0xffffffffffffff88,local_60,(size_t)local_58);
          __buf = __buf_00;
          if (pcVar18 == (char *)0x0) goto LAB_00166f21;
          this_01 = (FeatureIndex *)this_00;
          StringBuffer::write(this_00,(int)pcVar18,__buf_00,(size_t)pFVar14);
          __buf = extraout_RDX_05;
          pcVar19 = local_78;
        }
        else {
          if (bVar2 != 0x74) goto LAB_00166d8c;
          this_01 = (FeatureIndex *)this_00;
          StringBuffer::operator<<(this_00,(ulong)local_48->rnode->char_type);
          __buf = extraout_RDX_03;
        }
      }
      else if (bVar2 == 0x75) {
        this_01 = (FeatureIndex *)this_00;
        StringBuffer::write(this_00,(int)local_38,__buf,(size_t)pFVar14);
        __buf = extraout_RDX_06;
      }
      else {
        if ((bVar2 == 0x77) && (pmVar4 = local_48->rnode, pmVar4->stat == '\0')) {
          StringBuffer::write(this_00,(int)pmVar4->surface,(void *)(ulong)pmVar4->length,
                              (size_t)pFVar14);
        }
LAB_00166d8c:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                   ,0x73);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x16b);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"false",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"unknown meta char: ",0x13);
        local_6c = CONCAT31(local_6c._1_3_,*pcVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,(char *)&stack0xffffffffffffff94,1);
        this_01 = (FeatureIndex *)&stack0xffffffffffffff87;
        die::~die((die *)this_01);
        __buf = extraout_RDX_04;
      }
    }
    else if (cVar1 == '\\') {
      bVar2 = pcVar18[1];
      pFVar14 = (FeatureIndex *)(ulong)bVar2;
      bVar8 = 0;
      if (bVar2 < 0x66) {
        if (bVar2 == 0x5c) {
          bVar8 = 0x5c;
        }
        else if (bVar2 == 0x61) {
          bVar8 = 7;
        }
        else if (bVar2 == 0x62) {
          bVar8 = 8;
        }
      }
      else {
        __buf = (void *)(ulong)(bVar2 - 0x6e);
        if (bVar2 - 0x6e < 9) {
          pFVar14 = (FeatureIndex *)
                    ((long)&switchD_00166d1d::switchdataD_001838b8 +
                    (long)(int)(&switchD_00166d1d::switchdataD_001838b8)[(long)__buf]);
          switch(__buf) {
          case (void *)0x0:
            bVar8 = 10;
            break;
          case (void *)0x4:
            bVar8 = 0xd;
            break;
          case (void *)0x5:
            bVar8 = 0x20;
            break;
          case (void *)0x6:
            bVar8 = 9;
            break;
          case (void *)0x8:
            bVar8 = 0xb;
          }
        }
        else if (bVar2 == 0x66) {
          bVar8 = 0xc;
        }
      }
      this_01 = (FeatureIndex *)this_00;
      local_78 = pcVar18 + 1;
      StringBuffer::write(this_00,(uint)bVar8,__buf,(size_t)pFVar14);
      __buf = extraout_RDX_07;
      pcVar19 = pcVar18 + 1;
    }
    else {
      local_78 = pcVar18;
      if (cVar1 == '\0') break;
      this_01 = (FeatureIndex *)this_00;
      StringBuffer::write(this_00,(int)cVar1,__buf,(size_t)pFVar14);
      __buf = extraout_RDX_02;
      pcVar19 = pcVar18;
    }
    pcVar18 = pcVar19 + 1;
  } while( true );
  StringBuffer::write(this_00,0,__buf,(size_t)pFVar14);
  this_01 = local_68;
  local_6c = (*local_68->_vptr_FeatureIndex[6])();
  __buf = extraout_RDX_08;
  if (local_6c != -1) {
    iVar5._M_current =
         (local_68->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pFVar14 = local_68;
    if (iVar5._M_current ==
        (local_68->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      this_01 = local_40;
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)local_40,iVar5,&stack0xffffffffffffff94);
      __buf = extraout_RDX_09;
    }
    else {
      *iVar5._M_current = local_6c;
      (local_68->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar5._M_current + 1;
    }
  }
LAB_00166f21:
  ppcVar20 = ppcVar20 + 1;
  if (ppcVar20 ==
      (local_68->unigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) goto LAB_00166f37;
  goto LAB_00166cb3;
}

Assistant:

bool FeatureIndex::buildUnigramFeature(LearnerPath *path,
                                       const char *ufeature) {
  scoped_fixed_array<char, BUFSIZE> ubuf;
  scoped_fixed_array<char *, POSSIZE> F;

  feature_.clear();
  std::strncpy(ubuf.get(), ufeature, ubuf.size());
  const size_t usize = tokenizeCSV(ubuf.get(), F.get(), F.size());

  for (std::vector<const char*>::const_iterator it = unigram_templs_.begin();
       it != unigram_templs_.end(); ++it) {
    const char *p = *it;
    os_.clear();

    for (; *p; p++) {
      switch (*p) {
        default: os_ << *p; break;
        case '\\': os_ << getEscapedChar(*++p); break;
        case '%': {
          switch (*++p) {
            case 'F':  {
              const char *r = getIndex(const_cast<char **>(&p), F.get(), usize);
              if (!r) goto NEXT;
              os_ << r;
            } break;
            case 't':  os_ << (size_t)path->rnode->char_type;     break;
            case 'u':  os_ << ufeature; break;
            case 'w':
              if (path->rnode->stat == MECAB_NOR_NODE) {
                os_.write(path->rnode->surface, path->rnode->length);
              }
            default:
              CHECK_DIE(false) << "unknown meta char: " <<  *p;
          }
        }
      }
    }

    os_ << '\0';
    ADDB(os_.str());

 NEXT: continue;
  }

  COPY_FEATURE(path->rnode->fvector);

  return true;
}